

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_error.cc
# Opt level: O2

void RM_PrintError(RC rc)

{
  ostream *poVar1;
  int *piVar2;
  char *pcVar3;
  
  if (rc - 0x65U < 0xb) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"RM warning: ");
    pcVar3 = _ZL10RM_WarnMsg_rel + *(int *)(_ZL10RM_WarnMsg_rel + (ulong)(rc - 0x65U) * 4);
  }
  else {
    if (rc == 0) {
      poVar1 = (ostream *)&std::cerr;
      pcVar3 = "RM_PrintError called with return code of 0\n";
      goto LAB_00117e47;
    }
    if (rc != -0xb) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"RM error: ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,rc);
      pcVar3 = " is out of bounds\n";
      goto LAB_00117e47;
    }
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    poVar1 = (ostream *)&std::cerr;
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  pcVar3 = "\n";
LAB_00117e47:
  std::operator<<(poVar1,pcVar3);
  return;
}

Assistant:

void RM_PrintError(RC rc)
{
  // Check the return code is within proper limits
  if (rc >= START_RM_WARN && rc <= RM_LASTWARN)
    // Print warning
    cerr << "RM warning: " << RM_WarnMsg[rc - START_RM_WARN] << "\n";
  // Error codes are negative, so invert everything
  else if (-rc >= -START_RM_ERR && -rc < -RM_LASTERROR)
    // Print error
    cerr << "RM error: " << RM_ErrorMsg[-rc + START_RM_ERR] << "\n";
  else if (rc == PF_UNIX)
#ifdef PC
      cerr << "OS error\n";
#else
      cerr << strerror(errno) << "\n";
#endif
  else if (rc == 0)
    cerr << "RM_PrintError called with return code of 0\n";
  else
    cerr << "RM error: " << rc << " is out of bounds\n";
}